

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O2

bool __thiscall
MeteomaticsApiClient::readMultiPointTimeSeriesBin
          (MeteomaticsApiClient *this,MemoryClass *mem,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *results,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *times)

{
  int32_t k;
  int iVar1;
  int iVar2;
  int32_t nParameter;
  int32_t nTimes;
  int32_t nCoords;
  Matrix tmpMat;
  double t;
  vector<double,_std::allocator<double>_> tmpValues;
  double value;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_88;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_70;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  double local_60;
  string local_58;
  double local_38;
  
  local_70 = results;
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)times;
  MMIntern::MemoryClass::operator>>(mem,&local_8c);
  for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
    MMIntern::MemoryClass::operator>>(mem,&local_94);
    local_88.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::reserve(&local_88,(long)local_94);
    for (iVar2 = 0; iVar2 < local_94; iVar2 = iVar2 + 1) {
      MMIntern::MemoryClass::operator>>(mem,&local_98);
      MMIntern::MemoryClass::operator>>(mem,&local_60);
      convDateIso8601_abi_cxx11_(&local_58,this,local_60);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_68,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)&local_58,(long)local_98);
      for (iVar1 = 0; iVar1 < local_98; iVar1 = iVar1 + 1) {
        MMIntern::MemoryClass::operator>>(mem,&local_38);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)&local_58,&local_38);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_88,(value_type *)&local_58);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_58);
    }
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::push_back(local_70,&local_88);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_88);
  }
  return true;
}

Assistant:

bool MeteomaticsApiClient::readMultiPointTimeSeriesBin(MMIntern::MemoryClass& mem, std::vector<Matrix>& results, std::vector<std::string>& times) const
{
    int32_t nCoords;
    mem.read(nCoords);
    
    for (int32_t i=0; i<nCoords; i++)
    {
        int32_t nTimes;
        mem.read(nTimes);
        
        Matrix tmpMat;
        tmpMat.reserve(nTimes);
        for (int32_t j=0; j<nTimes; j++)
        {
            int32_t nParameter;
            mem.read(nParameter);
            
            double t;
            mem.read(t);
            times.push_back(convDateIso8601(t));
            
            std::vector<double> tmpValues;
            tmpValues.reserve(nParameter);
            for (int32_t k=0; k<nParameter; k++)
            {
                double value;
                mem.read(value);
                tmpValues.push_back(value);
            }
            tmpMat.push_back(tmpValues);
        }
        results.push_back(tmpMat);
    }
    
    return true;
}